

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int pcache1Free(void *p)

{
  PgFreeslot *pSlot;
  int nFreed;
  void *p_local;
  
  pSlot._4_4_ = 0;
  if (p == (void *)0x0) {
    p_local._4_4_ = 0;
  }
  else {
    if ((p < pcache1_g.pStart) || (pcache1_g.pEnd <= p)) {
      pSlot._4_4_ = sqlite3MallocSize(p);
      sqlite3_mutex_enter(pcache1_g.mutex);
      sqlite3StatusAdd(2,-pSlot._4_4_);
      sqlite3_mutex_leave(pcache1_g.mutex);
      sqlite3_free(p);
    }
    else {
      sqlite3_mutex_enter(pcache1_g.mutex);
      sqlite3StatusAdd(1,-1);
      *(PgFreeslot **)p = pcache1_g.pFree;
      pcache1_g.nFreeSlot = pcache1_g.nFreeSlot + 1;
      pcache1_g.bUnderPressure = (int)(pcache1_g.nFreeSlot < pcache1_g.nReserve);
      pcache1_g.pFree = (PgFreeslot *)p;
      sqlite3_mutex_leave(pcache1_g.mutex);
    }
    p_local._4_4_ = pSlot._4_4_;
  }
  return p_local._4_4_;
}

Assistant:

static int pcache1Free(void *p){
  int nFreed = 0;
  if( p==0 ) return 0;
  if( p>=pcache1.pStart && p<pcache1.pEnd ){
    PgFreeslot *pSlot;
    sqlite3_mutex_enter(pcache1.mutex);
    sqlite3StatusAdd(SQLITE_STATUS_PAGECACHE_USED, -1);
    pSlot = (PgFreeslot*)p;
    pSlot->pNext = pcache1.pFree;
    pcache1.pFree = pSlot;
    pcache1.nFreeSlot++;
    pcache1.bUnderPressure = pcache1.nFreeSlot<pcache1.nReserve;
    assert( pcache1.nFreeSlot<=pcache1.nSlot );
    sqlite3_mutex_leave(pcache1.mutex);
  }else{
    assert( sqlite3MemdebugHasType(p, MEMTYPE_PCACHE) );
    sqlite3MemdebugSetType(p, MEMTYPE_HEAP);
    nFreed = sqlite3MallocSize(p);
#ifndef SQLITE_DISABLE_PAGECACHE_OVERFLOW_STATS
    sqlite3_mutex_enter(pcache1.mutex);
    sqlite3StatusAdd(SQLITE_STATUS_PAGECACHE_OVERFLOW, -nFreed);
    sqlite3_mutex_leave(pcache1.mutex);
#endif
    sqlite3_free(p);
  }
  return nFreed;
}